

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O2

int __thiscall
yactfr::internal::PseudoVarWithIntRangesType::clone
          (PseudoVarWithIntRangesType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,
          ...)

{
  __uniq_ptr_impl<yactfr::internal::PseudoVarWithIntRangesType,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
  _Var1;
  undefined1 local_50 [8];
  __uniq_ptr_impl<yactfr::internal::PseudoVarWithIntRangesType,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
  local_48;
  vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
  local_40;
  PseudoNamedDts local_28;
  
  PseudoVarType::_clonePseudoOpts(&local_28,(PseudoVarType *)__fn);
  std::
  vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
  ::vector(&local_40,
           (vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
            *)(__fn + 0xc0));
  tryCloneAttrs((MapItem *)local_50);
  std::
  make_unique<yactfr::internal::PseudoVarWithIntRangesType,boost::optional<yactfr::internal::PseudoDataLoc>const&,std::vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,std::default_delete<yactfr::internal::PseudoNamedDt>>,std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,std::default_delete<yactfr::internal::PseudoNamedDt>>>>,std::vector<yactfr::IntegerRangeSet<unsigned_long_long,false>,std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,false>>>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,yactfr::TextLocation_const&>
            ((optional<yactfr::internal::PseudoDataLoc> *)&local_48,
             (vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
              *)(__fn + 0x50),
             (vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
              *)&local_28,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             &local_40,(TextLocation *)local_50);
  _Var1._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoVarWithIntRangesType_*,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoVarWithIntRangesType_*,_false>._M_head_impl =
       local_48._M_t.
       super__Tuple_impl<0UL,_yactfr::internal::PseudoVarWithIntRangesType_*,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
       .super__Head_base<0UL,_yactfr::internal::PseudoVarWithIntRangesType_*,_false>._M_head_impl;
  local_48._M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PseudoVarWithIntRangesType_*,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
  .super__Head_base<0UL,_yactfr::internal::PseudoVarWithIntRangesType_*,_false>._M_head_impl =
       (tuple<yactfr::internal::PseudoVarWithIntRangesType_*,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
        )(_Tuple_impl<0UL,_yactfr::internal::PseudoVarWithIntRangesType_*,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
          )0x0;
  (this->super_PseudoVarType).super_PseudoDt._vptr_PseudoDt =
       (_func_int **)
       _Var1._M_t.
       super__Tuple_impl<0UL,_yactfr::internal::PseudoVarWithIntRangesType_*,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
       .super__Head_base<0UL,_yactfr::internal::PseudoVarWithIntRangesType_*,_false>._M_head_impl;
  std::
  unique_ptr<yactfr::internal::PseudoVarWithIntRangesType,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
  ::~unique_ptr((unique_ptr<yactfr::internal::PseudoVarWithIntRangesType,_std::default_delete<yactfr::internal::PseudoVarWithIntRangesType>_>
                 *)&local_48);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_50);
  std::
  vector<yactfr::IntegerRangeSet<unsigned_long_long,_false>,_std::allocator<yactfr::IntegerRangeSet<unsigned_long_long,_false>_>_>
  ::~vector(&local_40);
  std::
  vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
  ::~vector(&local_28);
  return (int)this;
}

Assistant:

PseudoDt::Up PseudoVarWithIntRangesType::clone() const
{
    return std::make_unique<PseudoVarWithIntRangesType>(this->pseudoSelLoc(),
                                                        this->_clonePseudoOpts(),
                                                        RangeSets {_rangeSets},
                                                        tryCloneAttrs(this->attrs()),
                                                        this->loc());
}